

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_features.c
# Opt level: O0

LY_ERR lys_feature_value(lys_module *module,char *feature)

{
  lysp_module *pmod;
  size_t len;
  lysp_feature *plVar1;
  lysp_feature *f;
  char *feature_local;
  lys_module *module_local;
  
  if (module == (lys_module *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","module",
           "lys_feature_value");
    module_local._4_4_ = LY_EINVAL;
  }
  else if (module->parsed == (lysp_module *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","module->parsed",
           "lys_feature_value");
    module_local._4_4_ = LY_EINVAL;
  }
  else if (feature == (char *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","feature",
           "lys_feature_value");
    module_local._4_4_ = LY_EINVAL;
  }
  else {
    pmod = module->parsed;
    len = strlen(feature);
    plVar1 = lysp_feature_find(pmod,feature,len,'\0');
    if (plVar1 == (lysp_feature *)0x0) {
      module_local._4_4_ = LY_ENOTFOUND;
    }
    else if ((plVar1->flags & 0x20) == 0) {
      module_local._4_4_ = LY_ENOT;
    }
    else {
      module_local._4_4_ = LY_SUCCESS;
    }
  }
  return module_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lys_feature_value(const struct lys_module *module, const char *feature)
{
    const struct lysp_feature *f;

    LY_CHECK_ARG_RET(NULL, module, module->parsed, feature, LY_EINVAL);

    /* search for the specified feature */
    f = lysp_feature_find(module->parsed, feature, strlen(feature), 0);
    LY_CHECK_RET(!f, LY_ENOTFOUND);

    /* feature disabled */
    if (!(f->flags & LYS_FENABLED)) {
        return LY_ENOT;
    }

    /* feature enabled */
    return LY_SUCCESS;
}